

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtCompoundCompoundCollisionAlgorithm::processCollision
          (cbtCompoundCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  int *piVar1;
  undefined8 *puVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint uVar17;
  uint uVar18;
  undefined8 uVar19;
  cbtCollisionShape *pcVar20;
  _func_int **pp_Var21;
  long *plVar22;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar23;
  ulong uVar24;
  cbtTransform *pcVar25;
  cbtDbvtNode *pcVar26;
  cbtDbvtNode *pcVar27;
  cbtDbvtNode *pcVar28;
  undefined8 *puVar29;
  void *pvVar30;
  cbtDispatcher *pcVar31;
  cbtSimplePair *pcVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  cbtCompoundCompoundCollisionAlgorithm *pcVar36;
  uint uVar37;
  sStkNN *psVar38;
  cbtSimplePair *pcVar39;
  cbtHashedSimplePairCache *pcVar40;
  cbtCollisionObject *pcVar41;
  long lVar42;
  long lVar43;
  cbtCollisionObject *pcVar44;
  int iVar45;
  int iVar46;
  int curSize;
  int iVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  cbtManifoldArray manifoldArray_1;
  cbtCompoundCompoundLeafCallback callback;
  cbtPersistentManifold localManifolds [4];
  cbtAlignedObjectArray<cbtDbvt::sStkNN> local_1110;
  cbtCompoundCompoundCollisionAlgorithm *local_10f0;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  long local_10c8;
  cbtCollisionObjectWrapper *local_10c0;
  cbtCollisionShape *local_10b8;
  undefined8 local_10b0;
  float local_10a8;
  float local_10a0;
  float local_109c;
  float local_1098;
  float local_1094;
  ulong local_1090;
  float local_1088;
  long local_1080;
  cbtCollisionObjectWrapper *local_1078;
  undefined1 local_1070 [32];
  cbtDispatcher *local_1050;
  undefined8 local_1048;
  cbtManifoldResult *local_1040;
  cbtHashedSimplePairCache *local_1038;
  cbtPersistentManifold *local_1030;
  undefined8 local_1028;
  float local_1020;
  ulong local_1018;
  float local_1010;
  undefined1 local_1008 [16];
  cbtCollisionShape *local_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [16];
  undefined1 local_f68 [16];
  undefined1 local_f58 [16];
  undefined1 local_f48 [16];
  undefined1 local_f38 [16];
  undefined1 local_f28 [16];
  undefined1 local_f18 [16];
  undefined1 local_f08 [16];
  undefined1 local_ef8 [8];
  ulong uStack_ef0;
  undefined8 local_ee8;
  uint local_ee0;
  undefined4 local_edc;
  undefined8 local_ed8;
  uint uStack_ed0;
  undefined4 local_ecc;
  undefined1 local_ec8 [8];
  float fStack_ec0;
  
  pcVar20 = body0Wrap->m_shape;
  local_10b8 = body1Wrap->m_shape;
  pp_Var21 = local_10b8[3]._vptr_cbtCollisionShape;
  if (pcVar20[3]._vptr_cbtCollisionShape != (_func_int **)0x0 && pp_Var21 != (_func_int **)0x0) {
    local_10e8._8_8_ = local_10e8._0_8_;
    local_10e8._0_8_ = dispatchInfo;
    local_10d8._8_8_ = local_10d8._0_8_;
    local_10d8._0_8_ = pcVar20[3]._vptr_cbtCollisionShape;
    local_10c0 = body1Wrap;
    if ((pcVar20[3].m_shapeType != this->m_compoundShapeRevision0) ||
       (local_10b8[3].m_shapeType != this->m_compoundShapeRevision1)) {
      removeChildAlgorithms(this);
      this->m_compoundShapeRevision0 = pcVar20[3].m_shapeType;
      this->m_compoundShapeRevision1 = local_10b8[3].m_shapeType;
    }
    lVar42 = 0;
    local_1070[0x18] = 1;
    local_1070._16_8_ = (cbtPersistentManifold **)0x0;
    local_1070._4_4_ = 0;
    local_1070._8_4_ = 0;
    do {
      cbtPersistentManifold::cbtPersistentManifold((cbtPersistentManifold *)(local_ef8 + lVar42));
      lVar42 = lVar42 + 0x3b0;
    } while (lVar42 != 0xec0);
    local_1008._0_8_ = pp_Var21;
    local_ff0 = pcVar20;
    if (((cbtPersistentManifold **)local_1070._16_8_ != (cbtPersistentManifold **)0x0) &&
       ((bool)local_1070[0x18] == true)) {
      cbtAlignedFreeInternal((void *)local_1070._16_8_);
    }
    local_1070._16_8_ = local_ef8;
    local_1070._24_8_ = local_1070._24_8_ & 0xffffffffffffff00;
    local_1070._8_4_ = 4;
    pcVar40 = this->m_childCollisionAlgorithmCache;
    iVar47 = (pcVar40->m_overlappingPairArray).m_size;
    local_10f0 = this;
    local_1078 = body0Wrap;
    if (0 < iVar47) {
      lVar42 = 0;
      do {
        local_1070._4_4_ = 0;
        plVar22 = (long *)(pcVar40->m_overlappingPairArray).m_data[lVar42].field_2.m_userPointer;
        if (plVar22 != (long *)0x0) {
          (**(code **)(*plVar22 + 0x20))(plVar22,local_1070);
          iVar47 = local_1070._4_4_;
          if (0 < (int)local_1070._4_4_) {
            lVar43 = 0;
            do {
              this_00 = *(cbtPersistentManifold **)(local_1070._16_8_ + lVar43 * 8);
              if (this_00->m_cachedPoints != 0) {
                resultOut->m_manifoldPtr = this_00;
                pcVar44 = resultOut->m_body0Wrap->m_collisionObject;
                pcVar23 = resultOut->m_body1Wrap->m_collisionObject;
                pcVar41 = pcVar23;
                if (this_00->m_body0 != pcVar44) {
                  pcVar41 = pcVar44;
                  pcVar44 = pcVar23;
                }
                cbtPersistentManifold::refreshContactPoints
                          (this_00,&pcVar44->m_worldTransform,&pcVar41->m_worldTransform);
                resultOut->m_manifoldPtr = (cbtPersistentManifold *)0x0;
                iVar47 = local_1070._4_4_;
              }
              lVar43 = lVar43 + 1;
            } while (lVar43 < iVar47);
          }
          this = local_10f0;
          if (iVar47 < 0) {
            if ((int)local_1070._8_4_ < 0) {
              if (((cbtPersistentManifold **)local_1070._16_8_ != (cbtPersistentManifold **)0x0) &&
                 ((bool)local_1070[0x18] == true)) {
                cbtAlignedFreeInternal((void *)local_1070._16_8_);
              }
              local_1070[0x18] = 1;
              local_1070._16_8_ = (cbtPersistentManifold **)0x0;
              local_1070._8_4_ = 0;
            }
            lVar43 = (long)iVar47;
            do {
              *(cbtPersistentManifold **)(local_1070._16_8_ + lVar43 * 8) =
                   (cbtPersistentManifold *)0x0;
              lVar43 = lVar43 + 1;
            } while (lVar43 != 0);
          }
          iVar47 = (pcVar40->m_overlappingPairArray).m_size;
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 < iVar47);
    }
    local_1070._4_4_ = 0;
    cbtAlignedObjectArray<cbtPersistentManifold_*>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtPersistentManifold_*> *)local_1070);
    local_1038 = this->m_childCollisionAlgorithmCache;
    local_1050 = (this->super_cbtCompoundCollisionAlgorithm).super_cbtActivatingCollisionAlgorithm.
                 super_cbtCollisionAlgorithm.m_dispatcher;
    local_1030 = (this->super_cbtCompoundCollisionAlgorithm).m_sharedManifold;
    local_1070._0_4_ = 0xb484e8;
    local_1070._4_4_ = 0;
    local_1070._8_4_ = 0;
    local_1070._16_8_ = local_1078;
    local_1070._24_8_ = local_10c0;
    local_1048 = local_10e8._0_8_;
    local_1040 = resultOut;
    cbtTransform::inverse(local_1078->m_worldTransform);
    lVar42 = *(long *)local_10d8._0_8_;
    if ((lVar42 != 0) && (uVar24 = *(ulong *)local_1008._0_8_, uVar24 != 0)) {
      iVar47 = 1;
      iVar46 = 0x7c;
      pcVar25 = local_10c0->m_worldTransform;
      cVar3 = (pcVar25->m_basis).m_el[1].m_floats[1];
      cVar4 = (pcVar25->m_basis).m_el[1].m_floats[0];
      cVar5 = (pcVar25->m_basis).m_el[0].m_floats[1];
      cVar6 = (pcVar25->m_basis).m_el[0].m_floats[0];
      cVar7 = (pcVar25->m_basis).m_el[1].m_floats[2];
      cVar8 = (pcVar25->m_basis).m_el[0].m_floats[2];
      cVar9 = (pcVar25->m_basis).m_el[2].m_floats[0];
      cVar10 = (pcVar25->m_basis).m_el[2].m_floats[1];
      cVar11 = (pcVar25->m_basis).m_el[2].m_floats[2];
      auVar48 = vmulss_avx512f(ZEXT416((uint)local_ef8._4_4_),ZEXT416((uint)cVar3));
      auVar49 = vmulss_avx512f(ZEXT416((uint)cVar3),ZEXT416((uint)local_ee8._4_4_));
      auVar50 = vmulss_avx512f(ZEXT416((uint)cVar3),ZEXT416(local_ed8._4_4_));
      auVar51 = vmulss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)local_ef8._4_4_));
      auVar52 = vmulss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)local_ee8._4_4_));
      auVar53 = vmulss_avx512f(ZEXT416((uint)cVar4),ZEXT416(local_ed8._4_4_));
      auVar54 = vmulss_avx512f(ZEXT416((uint)local_ef8._4_4_),ZEXT416((uint)cVar7));
      auVar55 = vmulss_avx512f(ZEXT416((uint)cVar7),ZEXT416((uint)local_ee8._4_4_));
      auVar56 = vfmadd231ss_avx512f(auVar48,ZEXT416((uint)cVar5),ZEXT416((uint)local_ef8._0_4_));
      auVar49 = vfmadd231ss_avx512f(auVar49,ZEXT416((uint)cVar5),ZEXT416((uint)local_ee8));
      auVar48 = vfmadd231ss_fma(auVar50,ZEXT416((uint)local_ed8),ZEXT416((uint)cVar5));
      fVar57 = (pcVar25->m_origin).m_floats[1];
      auVar50 = vfmadd231ss_avx512f(auVar51,ZEXT416((uint)cVar6),ZEXT416((uint)local_ef8._0_4_));
      auVar51 = vfmadd231ss_avx512f(auVar52,ZEXT416((uint)cVar6),ZEXT416((uint)local_ee8));
      auVar52 = vfmadd231ss_avx512f(auVar53,ZEXT416((uint)local_ed8),ZEXT416((uint)cVar6));
      cVar3 = (pcVar25->m_origin).m_floats[0];
      auVar53 = vfmadd231ss_avx512f(auVar54,ZEXT416((uint)cVar8),ZEXT416((uint)local_ef8._0_4_));
      auVar54 = vfmadd231ss_avx512f(auVar55,ZEXT416((uint)cVar8),ZEXT416((uint)local_ee8));
      local_10e8 = vfmadd231ss_avx512f(auVar50,ZEXT416((uint)cVar9),ZEXT416((uint)uStack_ef0));
      local_f38 = vfmadd231ss_avx512f(auVar51,ZEXT416((uint)cVar9),ZEXT416(local_ee0));
      local_10d8 = vfmadd231ss_avx512f(auVar56,ZEXT416((uint)cVar10),ZEXT416((uint)uStack_ef0));
      local_f48 = vfmadd231ss_avx512f(auVar49,ZEXT416((uint)cVar10),ZEXT416(local_ee0));
      local_1008 = vfmadd231ss_avx512f(auVar53,ZEXT416((uint)cVar11),ZEXT416((uint)uStack_ef0));
      local_f58 = vfmadd231ss_avx512f(auVar54,ZEXT416((uint)cVar11),ZEXT416(local_ee0));
      local_f98 = vfmadd231ss_avx512f(auVar52,ZEXT416(uStack_ed0),ZEXT416((uint)cVar9));
      local_fa8 = vfmadd231ss_fma(auVar48,ZEXT416(uStack_ed0),ZEXT416((uint)cVar10));
      auVar48 = vmulss_avx512f(ZEXT416((uint)cVar7),ZEXT416(local_ed8._4_4_));
      auVar51 = vmulss_avx512f(ZEXT416(local_ed8._4_4_),ZEXT416((uint)fVar57));
      auVar48 = vfmadd231ss_fma(auVar48,ZEXT416((uint)local_ed8),ZEXT416((uint)cVar8));
      auVar49 = vfmadd231ss_fma(ZEXT416((uint)((float)local_ef8._4_4_ * fVar57)),
                                ZEXT416((uint)cVar3),ZEXT416((uint)local_ef8._0_4_));
      cVar4 = (pcVar25->m_origin).m_floats[2];
      auVar50 = vfmadd231ss_fma(ZEXT416((uint)(local_ee8._4_4_ * fVar57)),ZEXT416((uint)cVar3),
                                ZEXT416((uint)local_ee8));
      auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)cVar3),ZEXT416((uint)local_ed8));
      local_fb8 = vfmadd231ss_fma(auVar48,ZEXT416(uStack_ed0),ZEXT416((uint)cVar11));
      auVar48 = vfmadd231ss_fma(auVar49,ZEXT416((uint)cVar4),ZEXT416((uint)uStack_ef0));
      auVar49 = vfmadd231ss_fma(auVar50,ZEXT416((uint)cVar4),ZEXT416(local_ee0));
      auVar50 = vfmadd231ss_fma(auVar51,ZEXT416((uint)cVar4),ZEXT416(uStack_ed0));
      local_1094 = auVar48._0_4_ + (float)local_ec8._0_4_;
      local_109c = auVar49._0_4_ + (float)local_ec8._4_4_;
      local_10a0 = auVar50._0_4_ + fStack_ec0;
      local_1098 = resultOut->m_closestPointDistanceThreshold;
      local_1110.m_ownsMemory = false;
      local_1110.m_size = 0x80;
      local_1110.m_capacity = 0x80;
      auVar48._8_4_ = 0x7fffffff;
      auVar48._0_8_ = 0x7fffffff7fffffff;
      auVar48._12_4_ = 0x7fffffff;
      local_f08 = vandps_avx512vl(local_10e8,auVar48);
      local_f18 = vandps_avx512vl(local_10d8,auVar48);
      local_f28 = vandps_avx512vl(local_1008,auVar48);
      local_f68 = vandps_avx512vl(local_f38,auVar48);
      local_f78 = vandps_avx512vl(local_f48,auVar48);
      local_f88 = vandps_avx512vl(local_f58,auVar48);
      local_fc8 = vandps_avx512vl(local_f98,auVar48);
      local_fd8 = vandps_avx(local_fa8,auVar48);
      local_fe8 = vandps_avx(local_fb8,auVar48);
      local_1110.m_data = (sStkNN *)local_ef8;
      local_ef8 = (undefined1  [8])lVar42;
      uStack_ef0 = uVar24;
      do {
        lVar43 = (long)iVar47;
        iVar47 = iVar47 + -1;
        lVar42 = lVar43 + -1;
        pcVar26 = local_1110.m_data[lVar42].b;
        pcVar27 = local_1110.m_data[lVar42].a;
        fVar57 = (pcVar26->volume).mx.m_floats[0];
        fVar12 = (pcVar26->volume).mi.m_floats[0];
        fVar13 = (pcVar26->volume).mi.m_floats[1];
        fVar14 = (pcVar26->volume).mx.m_floats[1];
        fVar15 = (pcVar26->volume).mx.m_floats[2];
        fVar16 = (pcVar26->volume).mi.m_floats[2];
        fVar33 = (fVar14 + fVar13) * 0.5;
        fVar34 = (fVar16 + fVar15) * 0.5;
        fVar35 = (fVar57 + fVar12) * 0.5;
        fVar13 = (fVar14 - fVar13) * 0.5 + 0.0;
        auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * (float)local_10d8._0_4_)),
                                  ZEXT416((uint)fVar35),ZEXT416((uint)local_10e8._0_4_));
        fVar57 = (fVar57 - fVar12) * 0.5 + 0.0;
        fVar12 = (fVar15 - fVar16) * 0.5 + 0.0;
        auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (float)local_f18._0_4_)),
                                  ZEXT416((uint)fVar57),ZEXT416((uint)local_f08._0_4_));
        auVar48 = vfmadd231ss_fma(auVar48,ZEXT416((uint)fVar34),ZEXT416((uint)local_1008._0_4_));
        auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar12),ZEXT416((uint)local_f28._0_4_));
        fVar14 = auVar48._0_4_ + local_1094;
        if (((pcVar27->volume).mi.m_floats[0] <= local_1098 + auVar49._0_4_ + fVar14) &&
           ((fVar14 - auVar49._0_4_) - local_1098 <= (pcVar27->volume).mx.m_floats[0])) {
          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * (float)local_f48._0_4_)),
                                    ZEXT416((uint)fVar35),ZEXT416((uint)local_f38._0_4_));
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (float)local_f78._0_4_)),
                                    ZEXT416((uint)fVar57),ZEXT416((uint)local_f68._0_4_));
          auVar48 = vfmadd231ss_fma(auVar48,ZEXT416((uint)fVar34),ZEXT416((uint)local_f58._0_4_));
          auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar12),ZEXT416((uint)local_f88._0_4_));
          fVar14 = auVar48._0_4_ + local_109c;
          if (((pcVar27->volume).mi.m_floats[1] <= local_1098 + auVar49._0_4_ + fVar14) &&
             ((fVar14 - auVar49._0_4_) - local_1098 <= (pcVar27->volume).mx.m_floats[1])) {
            auVar48 = vfmadd132ss_fma(ZEXT416((uint)fVar35),
                                      ZEXT416((uint)(fVar33 * (float)local_fa8._0_4_)),
                                      ZEXT416((uint)local_f98._0_4_));
            auVar49 = vfmadd132ss_fma(ZEXT416((uint)fVar57),
                                      ZEXT416((uint)(fVar13 * (float)local_fd8._0_4_)),
                                      ZEXT416((uint)local_fc8._0_4_));
            auVar48 = vfmadd132ss_fma(ZEXT416((uint)fVar34),auVar48,ZEXT416((uint)local_fb8._0_4_));
            auVar49 = vfmadd132ss_fma(ZEXT416((uint)fVar12),auVar49,ZEXT416((uint)local_fe8._0_4_));
            fVar57 = auVar48._0_4_ + local_10a0;
            if (((pcVar27->volume).mi.m_floats[2] <= local_1098 + auVar49._0_4_ + fVar57) &&
               ((fVar57 - auVar49._0_4_) - local_1098 <= (pcVar27->volume).mx.m_floats[2])) {
              local_10c8 = lVar43;
              if (iVar46 < iVar47) {
                lVar43 = (long)local_1110.m_size * 2;
                if ((local_1110.m_size < (int)lVar43) && (local_1110.m_capacity < (int)lVar43)) {
                  local_1080 = lVar43;
                  if (local_1110.m_size == 0) {
                    psVar38 = (sStkNN *)0x0;
                  }
                  else {
                    psVar38 = (sStkNN *)cbtAlignedAllocInternal((long)local_1110.m_size << 5,0x10);
                    if (0 < (long)local_1110.m_size) {
                      lVar43 = 0;
                      do {
                        puVar29 = (undefined8 *)((long)&(local_1110.m_data)->a + lVar43);
                        uVar19 = puVar29[1];
                        puVar2 = (undefined8 *)((long)&psVar38->a + lVar43);
                        *puVar2 = *puVar29;
                        puVar2[1] = uVar19;
                        lVar43 = lVar43 + 0x10;
                      } while ((long)local_1110.m_size * 0x10 != lVar43);
                    }
                  }
                  if ((local_1110.m_data != (sStkNN *)0x0) && (local_1110.m_ownsMemory == true)) {
                    cbtAlignedFreeInternal(local_1110.m_data);
                  }
                  local_1110.m_ownsMemory = true;
                  local_1110._4_8_ = local_1080 << 0x20;
                  lVar43 = local_1080;
                  local_1110.m_data = psVar38;
                }
                iVar46 = (int)lVar43 + -4;
                local_1110.m_size = (int)lVar43;
              }
              iVar45 = (int)local_10c8;
              if ((pcVar27->field_2).childs[1] == (cbtDbvtNode *)0x0) {
                if ((pcVar26->field_2).childs[1] == (cbtDbvtNode *)0x0) {
                  (**(code **)(CONCAT44(local_1070._4_4_,local_1070._0_4_) + 0x10))
                            (local_1070,pcVar27,pcVar26);
                }
                else {
                  pcVar28 = (pcVar26->field_2).childs[0];
                  local_1110.m_data[lVar42].a = pcVar27;
                  local_1110.m_data[lVar42].b = pcVar28;
                  iVar47 = iVar45 + 1;
                  pcVar26 = (pcVar26->field_2).childs[1];
                  local_1110.m_data[local_10c8].a = pcVar27;
                  local_1110.m_data[local_10c8].b = pcVar26;
                }
              }
              else if ((pcVar26->field_2).childs[1] == (cbtDbvtNode *)0x0) {
                local_1110.m_data[lVar42].a = (pcVar27->field_2).childs[0];
                local_1110.m_data[lVar42].b = pcVar26;
                iVar47 = iVar45 + 1;
                local_1110.m_data[local_10c8].a = (pcVar27->field_2).childs[1];
                local_1110.m_data[local_10c8].b = pcVar26;
              }
              else {
                pcVar28 = (pcVar26->field_2).childs[0];
                local_1110.m_data[lVar42].a = (pcVar27->field_2).childs[0];
                local_1110.m_data[lVar42].b = pcVar28;
                iVar47 = iVar45 + 3;
                pcVar28 = (pcVar26->field_2).childs[0];
                local_1110.m_data[local_10c8].a = (pcVar27->field_2).childs[1];
                local_1110.m_data[local_10c8].b = pcVar28;
                pcVar28 = (pcVar26->field_2).childs[1];
                local_1110.m_data[local_10c8 + 1].a = (pcVar27->field_2).childs[0];
                local_1110.m_data[local_10c8 + 1].b = pcVar28;
                pcVar26 = (pcVar26->field_2).childs[1];
                local_1110.m_data[local_10c8 + 2].a = (pcVar27->field_2).childs[1];
                local_1110.m_data[local_10c8 + 2].b = pcVar26;
              }
            }
          }
        }
      } while (iVar47 != 0);
      cbtAlignedObjectArray<cbtDbvt::sStkNN>::~cbtAlignedObjectArray(&local_1110);
      this = local_10f0;
    }
    pcVar40 = this->m_childCollisionAlgorithmCache;
    local_1110.m_ownsMemory = true;
    local_1110.m_data = (sStkNN *)0x0;
    local_1110.m_size = 0;
    local_1110.m_capacity = 0;
    if (0 < (pcVar40->m_overlappingPairArray).m_size) {
      lVar42 = 0;
      local_10e8._0_8_ = pcVar40;
      do {
        pcVar39 = (pcVar40->m_overlappingPairArray).m_data;
        puVar29 = (undefined8 *)pcVar39[lVar42].field_2.m_userPointer;
        if (puVar29 != (undefined8 *)0x0) {
          pcVar25 = local_1078->m_worldTransform;
          pvVar30 = local_ff0[1].m_userPointer;
          lVar43 = (long)pcVar39[lVar42].m_indexA * 0x58;
          fVar57 = (pcVar25->m_basis).m_el[0].m_floats[1];
          auVar54._4_4_ = fVar57;
          auVar54._0_4_ = fVar57;
          auVar54._8_4_ = fVar57;
          auVar54._12_4_ = fVar57;
          fVar12 = (pcVar25->m_basis).m_el[1].m_floats[1];
          auVar63._4_4_ = fVar12;
          auVar63._0_4_ = fVar12;
          auVar63._8_4_ = fVar12;
          auVar63._12_4_ = fVar12;
          fVar13 = (pcVar25->m_basis).m_el[2].m_floats[1];
          auVar69._4_4_ = fVar13;
          auVar69._0_4_ = fVar13;
          auVar69._8_4_ = fVar13;
          auVar69._12_4_ = fVar13;
          fVar14 = *(float *)((long)pvVar30 + lVar43 + 0x18);
          cVar3 = (pcVar25->m_basis).m_el[0].m_floats[0];
          auVar56._4_4_ = cVar3;
          auVar56._0_4_ = cVar3;
          auVar56._8_4_ = cVar3;
          auVar56._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[1].m_floats[0];
          auVar65._4_4_ = cVar3;
          auVar65._0_4_ = cVar3;
          auVar65._8_4_ = cVar3;
          auVar65._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[2].m_floats[0];
          auVar71._4_4_ = cVar3;
          auVar71._0_4_ = cVar3;
          auVar71._8_4_ = cVar3;
          auVar71._12_4_ = cVar3;
          uVar37 = *(uint *)((long)pvVar30 + lVar43 + 8);
          cVar3 = (pcVar25->m_basis).m_el[0].m_floats[2];
          auVar60._4_4_ = cVar3;
          auVar60._0_4_ = cVar3;
          auVar60._8_4_ = cVar3;
          auVar60._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[1].m_floats[2];
          auVar67._4_4_ = cVar3;
          auVar67._0_4_ = cVar3;
          auVar67._8_4_ = cVar3;
          auVar67._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[2].m_floats[2];
          auVar73._4_4_ = cVar3;
          auVar73._0_4_ = cVar3;
          auVar73._8_4_ = cVar3;
          auVar73._12_4_ = cVar3;
          uVar17 = *(uint *)((long)pvVar30 + lVar43 + 0x28);
          uVar18 = *(uint *)((long)pvVar30 + lVar43 + 0x38);
          plVar22 = *(long **)((long)pvVar30 + lVar43 + 0x40);
          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar14)),ZEXT416(uVar37),auVar56);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar12)),ZEXT416(uVar37),auVar65);
          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar14)),auVar71,ZEXT416(uVar37));
          uVar37 = *(uint *)((long)pvVar30 + lVar43 + 0x30);
          auVar51 = vfmadd231ss_fma(auVar48,ZEXT416(uVar17),auVar60);
          auVar52 = vfmadd231ss_fma(auVar49,ZEXT416(uVar17),auVar67);
          auVar50 = vfmadd231ss_fma(auVar50,auVar73,ZEXT416(uVar17));
          fVar12 = *(float *)((long)pvVar30 + lVar43 + 0x34);
          auVar49 = vmulss_avx512f(auVar63,ZEXT416((uint)fVar12));
          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar12)),ZEXT416(uVar37),auVar56);
          auVar53 = vfmadd231ss_avx512f(auVar49,ZEXT416(uVar37),auVar65);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar12)),auVar71,ZEXT416(uVar37));
          auVar48 = vfmadd231ss_fma(auVar48,ZEXT416(uVar18),auVar60);
          auVar53 = vfmadd231ss_avx512f(auVar53,ZEXT416(uVar18),auVar67);
          auVar53 = vaddss_avx512f(auVar53,ZEXT416((uint)(pcVar25->m_origin).m_floats[1]));
          auVar49 = vfmadd231ss_fma(auVar49,auVar73,ZEXT416(uVar18));
          uVar24 = *(ulong *)((long)pvVar30 + lVar43 + 0x10);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = *(ulong *)((long)pvVar30 + lVar43 + 0x20);
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar24;
          auVar54 = vmulps_avx512vl(auVar54,auVar77);
          auVar48 = vinsertps_avx(ZEXT416((uint)(auVar48._0_4_ + (pcVar25->m_origin).m_floats[0])),
                                  auVar53,0x10);
          _local_ec8 = vinsertps_avx(auVar48,ZEXT416((uint)(auVar49._0_4_ +
                                                           (pcVar25->m_origin).m_floats[2])),0x28);
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)((long)pvVar30 + lVar43);
          auVar48 = vfmadd231ps_fma(auVar54,auVar53,auVar56);
          auVar48 = vfmadd231ps_fma(auVar48,auVar75,auVar60);
          auVar49 = vmulps_avx512vl(auVar77,auVar63);
          auVar49 = vfmadd231ps_fma(auVar49,auVar53,auVar65);
          local_ef8 = (undefined1  [8])vmovlps_avx(auVar48);
          auVar78._8_8_ = 0;
          auVar78._0_8_ = uVar24;
          auVar48 = vmulps_avx512vl(auVar78,auVar69);
          uStack_ef0 = (ulong)auVar51._0_4_;
          auVar48 = vfmadd231ps_fma(auVar48,auVar53,auVar71);
          auVar49 = vfmadd231ps_fma(auVar49,auVar75,auVar67);
          auVar48 = vfmadd231ps_fma(auVar48,auVar75,auVar73);
          local_ee8 = vmovlps_avx(auVar49);
          local_ee0 = auVar52._0_4_;
          local_edc = 0;
          local_ed8 = vmovlps_avx(auVar48);
          uStack_ed0 = auVar50._0_4_;
          local_ecc = 0;
          (**(code **)(*plVar22 + 0x10))(plVar22,local_ef8,&local_10b0,&local_1090);
          fVar57 = resultOut->m_closestPointDistanceThreshold;
          local_10d8._4_4_ = fVar57;
          local_10d8._0_4_ = fVar57;
          local_10d8._8_4_ = fVar57;
          local_10d8._12_4_ = fVar57;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = local_10b0;
          auVar48 = vsubps_avx(auVar49,local_10d8);
          local_10b0 = vmovlps_avx(auVar48);
          local_10a8 = local_10a8 - fVar57;
          auVar50._0_4_ = fVar57 + (float)local_1090;
          auVar50._4_4_ = fVar57 + (float)(local_1090 >> 0x20);
          auVar50._8_4_ = fVar57 + 0.0;
          auVar50._12_4_ = fVar57 + 0.0;
          local_1090 = vmovlps_avx(auVar50);
          local_1088 = fVar57 + local_1088;
          pvVar30 = local_10b8[1].m_userPointer;
          pcVar25 = local_10c0->m_worldTransform;
          lVar43 = (long)*(int *)(*(long *)(local_10e8._0_8_ + 0x18) + 4 + lVar42 * 0x10) * 0x58;
          fVar57 = *(float *)((long)pvVar30 + lVar43 + 0x18);
          uVar37 = *(uint *)((long)pvVar30 + lVar43 + 8);
          uVar17 = *(uint *)((long)pvVar30 + lVar43 + 0x28);
          uVar18 = *(uint *)((long)pvVar30 + lVar43 + 0x38);
          plVar22 = *(long **)((long)pvVar30 + lVar43 + 0x40);
          fVar12 = (pcVar25->m_basis).m_el[0].m_floats[1];
          auVar55._4_4_ = fVar12;
          auVar55._0_4_ = fVar12;
          auVar55._8_4_ = fVar12;
          auVar55._12_4_ = fVar12;
          fVar13 = (pcVar25->m_basis).m_el[1].m_floats[1];
          auVar64._4_4_ = fVar13;
          auVar64._0_4_ = fVar13;
          auVar64._8_4_ = fVar13;
          auVar64._12_4_ = fVar13;
          fVar14 = (pcVar25->m_basis).m_el[2].m_floats[1];
          auVar70._4_4_ = fVar14;
          auVar70._0_4_ = fVar14;
          auVar70._8_4_ = fVar14;
          auVar70._12_4_ = fVar14;
          cVar3 = (pcVar25->m_basis).m_el[0].m_floats[0];
          auVar58._4_4_ = cVar3;
          auVar58._0_4_ = cVar3;
          auVar58._8_4_ = cVar3;
          auVar58._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[1].m_floats[0];
          auVar66._4_4_ = cVar3;
          auVar66._0_4_ = cVar3;
          auVar66._8_4_ = cVar3;
          auVar66._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[2].m_floats[0];
          auVar72._4_4_ = cVar3;
          auVar72._0_4_ = cVar3;
          auVar72._8_4_ = cVar3;
          auVar72._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[0].m_floats[2];
          auVar61._4_4_ = cVar3;
          auVar61._0_4_ = cVar3;
          auVar61._8_4_ = cVar3;
          auVar61._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[1].m_floats[2];
          auVar68._4_4_ = cVar3;
          auVar68._0_4_ = cVar3;
          auVar68._8_4_ = cVar3;
          auVar68._12_4_ = cVar3;
          cVar3 = (pcVar25->m_basis).m_el[2].m_floats[2];
          auVar74._4_4_ = cVar3;
          auVar74._0_4_ = cVar3;
          auVar74._8_4_ = cVar3;
          auVar74._12_4_ = cVar3;
          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar57)),ZEXT416(uVar37),auVar58);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar13)),ZEXT416(uVar37),auVar66);
          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar57)),auVar72,ZEXT416(uVar37));
          uVar37 = *(uint *)((long)pvVar30 + lVar43 + 0x30);
          auVar51 = vfmadd231ss_fma(auVar48,ZEXT416(uVar17),auVar61);
          auVar52 = vfmadd231ss_fma(auVar49,ZEXT416(uVar17),auVar68);
          auVar50 = vfmadd231ss_fma(auVar50,auVar74,ZEXT416(uVar17));
          fVar57 = *(float *)((long)pvVar30 + lVar43 + 0x34);
          auVar49 = vmulss_avx512f(auVar64,ZEXT416((uint)fVar57));
          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar57)),ZEXT416(uVar37),auVar58);
          auVar53 = vfmadd231ss_avx512f(auVar49,ZEXT416(uVar37),auVar66);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar57)),auVar72,ZEXT416(uVar37));
          auVar48 = vfmadd231ss_fma(auVar48,ZEXT416(uVar18),auVar61);
          auVar53 = vfmadd231ss_avx512f(auVar53,ZEXT416(uVar18),auVar68);
          auVar53 = vaddss_avx512f(auVar53,ZEXT416((uint)(pcVar25->m_origin).m_floats[1]));
          auVar49 = vfmadd231ss_fma(auVar49,auVar74,ZEXT416(uVar18));
          uVar24 = *(ulong *)((long)pvVar30 + lVar43 + 0x10);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = *(ulong *)((long)pvVar30 + lVar43 + 0x20);
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar24;
          auVar54 = vmulps_avx512vl(auVar55,auVar79);
          auVar48 = vinsertps_avx(ZEXT416((uint)(auVar48._0_4_ + (pcVar25->m_origin).m_floats[0])),
                                  auVar53,0x10);
          _local_ec8 = vinsertps_avx(auVar48,ZEXT416((uint)(auVar49._0_4_ +
                                                           (pcVar25->m_origin).m_floats[2])),0x28);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)((long)pvVar30 + lVar43);
          auVar48 = vfmadd231ps_fma(auVar54,auVar62,auVar58);
          auVar48 = vfmadd231ps_fma(auVar48,auVar76,auVar61);
          auVar49 = vmulps_avx512vl(auVar79,auVar64);
          auVar49 = vfmadd231ps_fma(auVar49,auVar62,auVar66);
          local_ef8 = (undefined1  [8])vmovlps_avx(auVar48);
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar24;
          auVar48 = vmulps_avx512vl(auVar80,auVar70);
          uStack_ef0 = (ulong)auVar51._0_4_;
          auVar48 = vfmadd231ps_fma(auVar48,auVar62,auVar72);
          auVar49 = vfmadd231ps_fma(auVar49,auVar76,auVar68);
          auVar48 = vfmadd231ps_fma(auVar48,auVar76,auVar74);
          local_ee8 = vmovlps_avx(auVar49);
          local_ee0 = auVar52._0_4_;
          local_edc = 0;
          local_ed8 = vmovlps_avx(auVar48);
          uStack_ed0 = auVar50._0_4_;
          local_ecc = 0;
          (**(code **)(*plVar22 + 0x10))(plVar22,local_ef8,&local_1018,&local_1028);
          auVar51._8_8_ = 0;
          auVar51._0_8_ = local_1018;
          auVar49 = vsubps_avx(auVar51,local_10d8);
          local_1018 = vmovlps_avx(auVar49);
          fVar57 = local_10d8._0_4_;
          local_1010 = local_1010 - fVar57;
          auVar52._0_4_ = fVar57 + (float)local_1028;
          auVar52._4_4_ = local_10d8._4_4_ + (float)((ulong)local_1028 >> 0x20);
          auVar52._8_4_ = local_10d8._8_4_ + 0.0;
          auVar52._12_4_ = local_10d8._12_4_ + 0.0;
          local_1028 = vmovlps_avx(auVar52);
          auVar48 = vmovshdup_avx(auVar52);
          local_1020 = fVar57 + local_1020;
          if (((((auVar48._0_4_ < local_10b0._4_4_) ||
                (auVar59._8_8_ = 0, auVar59._0_8_ = local_1090,
                uVar24 = vcmpps_avx512vl(auVar59,auVar49,1), (uVar24 >> 1 & 1) != 0)) ||
               (local_1020 < local_10a8)) ||
              ((local_1088 < local_1010 || (auVar52._0_4_ < (float)local_10b0)))) ||
             (pcVar40 = (cbtHashedSimplePairCache *)local_10e8._0_8_, (uVar24 & 1) != 0)) {
            (**(code **)*puVar29)(puVar29);
            pcVar36 = local_10f0;
            pcVar31 = (local_10f0->super_cbtCompoundCollisionAlgorithm).
                      super_cbtActivatingCollisionAlgorithm.super_cbtCollisionAlgorithm.m_dispatcher
            ;
            (*pcVar31->_vptr_cbtDispatcher[0xf])(pcVar31,puVar29);
            uVar37 = (pcVar36->m_removePairs).m_size;
            local_10d8._8_8_ = 0;
            local_10d8._0_8_ = *(ulong *)(*(long *)(local_10e8._0_8_ + 0x18) + lVar42 * 0x10);
            if (uVar37 == (pcVar36->m_removePairs).m_capacity) {
              iVar47 = uVar37 * 2;
              if (uVar37 == 0) {
                iVar47 = 1;
              }
              if ((int)uVar37 < iVar47) {
                if (iVar47 == 0) {
                  pcVar39 = (cbtSimplePair *)0x0;
                }
                else {
                  pcVar39 = (cbtSimplePair *)cbtAlignedAllocInternal((long)iVar47 << 4,0x10);
                  uVar37 = (pcVar36->m_removePairs).m_size;
                }
                if (0 < (int)uVar37) {
                  lVar43 = 0;
                  do {
                    puVar29 = (undefined8 *)
                              ((long)&((pcVar36->m_removePairs).m_data)->m_indexA + lVar43);
                    uVar19 = puVar29[1];
                    puVar2 = (undefined8 *)((long)&pcVar39->m_indexA + lVar43);
                    *puVar2 = *puVar29;
                    puVar2[1] = uVar19;
                    lVar43 = lVar43 + 0x10;
                  } while ((ulong)uVar37 << 4 != lVar43);
                }
                pcVar32 = (pcVar36->m_removePairs).m_data;
                if ((pcVar32 != (cbtSimplePair *)0x0) &&
                   ((pcVar36->m_removePairs).m_ownsMemory == true)) {
                  cbtAlignedFreeInternal(pcVar32);
                }
                (pcVar36->m_removePairs).m_ownsMemory = true;
                (pcVar36->m_removePairs).m_data = pcVar39;
                (pcVar36->m_removePairs).m_capacity = iVar47;
                uVar37 = (pcVar36->m_removePairs).m_size;
              }
            }
            pcVar32 = (pcVar36->m_removePairs).m_data;
            pcVar39 = pcVar32 + (int)uVar37;
            uVar19 = vmovlps_avx(local_10d8);
            pcVar39->m_indexA = (int)uVar19;
            pcVar39->m_indexB = (int)((ulong)uVar19 >> 0x20);
            pcVar32[(int)uVar37].field_2.m_userPointer = (void *)0x0;
            piVar1 = &(pcVar36->m_removePairs).m_size;
            *piVar1 = *piVar1 + 1;
            pcVar40 = (cbtHashedSimplePairCache *)local_10e8._0_8_;
          }
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 < (pcVar40->m_overlappingPairArray).m_size);
    }
    pcVar36 = local_10f0;
    if (0 < (local_10f0->m_removePairs).m_size) {
      lVar42 = 4;
      lVar43 = 0;
      do {
        pcVar39 = (pcVar36->m_removePairs).m_data;
        (*pcVar36->m_childCollisionAlgorithmCache->_vptr_cbtHashedSimplePairCache[2])
                  (pcVar36->m_childCollisionAlgorithmCache,
                   (ulong)*(uint *)((long)pcVar39 + lVar42 + -4),
                   (ulong)*(uint *)((long)&pcVar39->m_indexA + lVar42));
        lVar43 = lVar43 + 1;
        lVar42 = lVar42 + 0x10;
      } while (lVar43 < (pcVar36->m_removePairs).m_size);
    }
    pcVar39 = (pcVar36->m_removePairs).m_data;
    if ((pcVar39 != (cbtSimplePair *)0x0) && ((pcVar36->m_removePairs).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(pcVar39);
    }
    (pcVar36->m_removePairs).m_ownsMemory = true;
    (pcVar36->m_removePairs).m_data = (cbtSimplePair *)0x0;
    (pcVar36->m_removePairs).m_size = 0;
    (pcVar36->m_removePairs).m_capacity = 0;
    cbtAlignedObjectArray<cbtPersistentManifold_*>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtPersistentManifold_*> *)&local_1110);
    return;
  }
  cbtCompoundCollisionAlgorithm::processCollision
            (&this->super_cbtCompoundCollisionAlgorithm,body0Wrap,body1Wrap,dispatchInfo,resultOut);
  return;
}

Assistant:

void cbtCompoundCompoundCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* col0ObjWrap = body0Wrap;
	const cbtCollisionObjectWrapper* col1ObjWrap = body1Wrap;

	cbtAssert(col0ObjWrap->getCollisionShape()->isCompound());
	cbtAssert(col1ObjWrap->getCollisionShape()->isCompound());
	const cbtCompoundShape* compoundShape0 = static_cast<const cbtCompoundShape*>(col0ObjWrap->getCollisionShape());
	const cbtCompoundShape* compoundShape1 = static_cast<const cbtCompoundShape*>(col1ObjWrap->getCollisionShape());

	const cbtDbvt* tree0 = compoundShape0->getDynamicAabbTree();
	const cbtDbvt* tree1 = compoundShape1->getDynamicAabbTree();
	if (!tree0 || !tree1)
	{
		return cbtCompoundCollisionAlgorithm::processCollision(body0Wrap, body1Wrap, dispatchInfo, resultOut);
	}
	///cbtCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if ((compoundShape0->getUpdateRevision() != m_compoundShapeRevision0) || (compoundShape1->getUpdateRevision() != m_compoundShapeRevision1))
	{
		///clear all
		removeChildAlgorithms();
		m_compoundShapeRevision0 = compoundShape0->getUpdateRevision();
		m_compoundShapeRevision1 = compoundShape1->getUpdateRevision();
	}

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, cbtCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the cbtCollisionAlgorithm
	{
		int i;
		cbtManifoldArray manifoldArray;
#ifdef USE_LOCAL_STACK
		cbtPersistentManifold localManifolds[4];
		manifoldArray.initializeFromBuffer(&localManifolds, 0, 4);
#endif
		cbtSimplePairArray& pairs = m_childCollisionAlgorithmCache->getOverlappingPairArray();
		for (i = 0; i < pairs.size(); i++)
		{
			if (pairs[i].m_userPointer)
			{
				cbtCollisionAlgorithm* algo = (cbtCollisionAlgorithm*)pairs[i].m_userPointer;
				algo->getAllContactManifolds(manifoldArray);
				for (int m = 0; m < manifoldArray.size(); m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	cbtCompoundCompoundLeafCallback callback(col0ObjWrap, col1ObjWrap, this->m_dispatcher, dispatchInfo, resultOut, this->m_childCollisionAlgorithmCache, m_sharedManifold);

	const cbtTransform xform = col0ObjWrap->getWorldTransform().inverse() * col1ObjWrap->getWorldTransform();
	MycollideTT(tree0->m_root, tree1->m_root, xform, &callback, resultOut->m_closestPointDistanceThreshold);

	//printf("#compound-compound child/leaf overlap =%d                      \r",callback.m_numOverlapPairs);

	//remove non-overlapping child pairs

	{
		cbtAssert(m_removePairs.size() == 0);

		//iterate over all children, perform an AABB check inside ProcessChildShape
		cbtSimplePairArray& pairs = m_childCollisionAlgorithmCache->getOverlappingPairArray();

		int i;
		cbtManifoldArray manifoldArray;

		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;

		for (i = 0; i < pairs.size(); i++)
		{
			if (pairs[i].m_userPointer)
			{
				cbtCollisionAlgorithm* algo = (cbtCollisionAlgorithm*)pairs[i].m_userPointer;

				{
					const cbtCollisionShape* childShape0 = 0;

					cbtTransform newChildWorldTrans0;
					childShape0 = compoundShape0->getChildShape(pairs[i].m_indexA);
					const cbtTransform& childTrans0 = compoundShape0->getChildTransform(pairs[i].m_indexA);
					newChildWorldTrans0 = col0ObjWrap->getWorldTransform() * childTrans0;
					childShape0->getAabb(newChildWorldTrans0, aabbMin0, aabbMax0);
				}
				cbtVector3 thresholdVec(resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold);
				aabbMin0 -= thresholdVec;
				aabbMax0 += thresholdVec;
				{
					const cbtCollisionShape* childShape1 = 0;
					cbtTransform newChildWorldTrans1;

					childShape1 = compoundShape1->getChildShape(pairs[i].m_indexB);
					const cbtTransform& childTrans1 = compoundShape1->getChildTransform(pairs[i].m_indexB);
					newChildWorldTrans1 = col1ObjWrap->getWorldTransform() * childTrans1;
					childShape1->getAabb(newChildWorldTrans1, aabbMin1, aabbMax1);
				}

				aabbMin1 -= thresholdVec;
				aabbMax1 += thresholdVec;

				if (!TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
				{
					algo->~cbtCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(algo);
					m_removePairs.push_back(cbtSimplePair(pairs[i].m_indexA, pairs[i].m_indexB));
				}
			}
		}
		for (int i = 0; i < m_removePairs.size(); i++)
		{
			m_childCollisionAlgorithmCache->removeOverlappingPair(m_removePairs[i].m_indexA, m_removePairs[i].m_indexB);
		}
		m_removePairs.clear();
	}
}